

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

man_page * clipp::make_man_page(group *cli,doc_string *progname,doc_formatting *fmt)

{
  param_filter *in_RCX;
  doc_formatting *in_RDX;
  documentation *in_RSI;
  group *in_RDI;
  man_page *man;
  usage_lines *in_stack_fffffffffffff630;
  string *in_stack_fffffffffffff638;
  man_page *in_stack_fffffffffffff640;
  man_page *this;
  group *cli_00;
  usage_lines *this_00;
  group *cli_01;
  documentation *this_01;
  documentation *in_stack_fffffffffffff7c8;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  string local_378 [760];
  string local_80 [55];
  undefined1 local_49 [40];
  string local_21;
  param_filter *local_20;
  documentation *local_10;
  
  local_21 = (string)0x0;
  cli_00 = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  man_page::man_page((man_page *)in_stack_fffffffffffff630);
  this_00 = (usage_lines *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"SYNOPSIS",(allocator *)this_00);
  std::__cxx11::string::string(local_378,(string *)in_RDX);
  usage_lines::usage_lines(this_00,cli_00,(string *)in_RDI,in_RDX);
  usage_lines::str_abi_cxx11_((usage_lines *)in_stack_fffffffffffff7c8);
  man_page::append_section
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638,(string *)in_stack_fffffffffffff630
            );
  std::__cxx11::string::~string(local_80);
  usage_lines::~usage_lines(in_stack_fffffffffffff630);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"OPTIONS",&local_399);
  cli_01 = (group *)0x0;
  this_01 = (documentation *)0x0;
  this = (man_page *)&stack0xfffffffffffff678;
  param_filter::param_filter((param_filter *)local_10);
  std::function<bool(clipp::parameter_const&)>::function<clipp::param_filter,void>
            ((function<bool_(const_clipp::parameter_&)> *)this,local_20);
  documentation::documentation(this_01,cli_01,(doc_formatting *)this_00,(filter_function *)cli_00);
  documentation::str_abi_cxx11_(in_stack_fffffffffffff7c8);
  man_page::append_section(this,&local_20->prefix_,(string *)local_10);
  std::__cxx11::string::~string(local_3c0);
  documentation::~documentation(local_10);
  std::function<bool_(const_clipp::parameter_&)>::~function
            ((function<bool_(const_clipp::parameter_&)> *)0x18c507);
  param_filter::~param_filter((param_filter *)0x18c511);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  return (man_page *)cli_00;
}

Assistant:

inline man_page
make_man_page(const group& cli,
              doc_string progname = "",
              const doc_formatting& fmt = doc_formatting{})
{
    man_page man;
    man.append_section("SYNOPSIS", usage_lines(cli,progname,fmt).str());
    man.append_section("OPTIONS", documentation(cli,fmt).str());
    return man;
}